

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itemviews.cpp
# Opt level: O0

bool __thiscall QAccessibleTable::isValid(QAccessibleTable *this)

{
  QAbstractItemView *pQVar1;
  QWidgetPrivate *pQVar2;
  byte local_9;
  
  pQVar1 = view((QAccessibleTable *)0x7f2d3b);
  local_9 = 0;
  if (pQVar1 != (QAbstractItemView *)0x0) {
    view((QAccessibleTable *)0x7f2d53);
    pQVar2 = qt_widget_private((QWidget *)0x7f2d5b);
    local_9 = (*(uint *)&(pQVar2->data).field_0x10 >> 0x12 & 1) != 0 ^ 0xff;
  }
  return (bool)(local_9 & 1);
}

Assistant:

bool QAccessibleTable::isValid() const
{
    return view() && !qt_widget_private(view())->data.in_destructor;
}